

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControl::canInsertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  QWidgetTextControlPrivate *pQVar6;
  ulong uVar7;
  long *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QWidgetTextControlPrivate *d;
  byte local_d1;
  size_t in_stack_ffffffffffffff30;
  long *str;
  undefined5 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  byte bVar8;
  undefined1 local_50 [24];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QWidgetTextControl *)0x71e130);
  if ((pQVar6->acceptRichText & 1U) == 0) {
    uVar5 = QMimeData::hasText();
    bVar8 = 0;
    local_d1 = 0;
    if ((uVar5 & 1) != 0) {
      QMimeData::text();
      bVar8 = 1;
      bVar4 = QString::isEmpty((QString *)0x71e2fa);
      local_d1 = bVar4 ^ 0xff;
    }
    if ((bVar8 & 1) != 0) {
      QString::~QString((QString *)0x71e31d);
    }
    goto LAB_0071e31f;
  }
  uVar7 = QMimeData::hasText();
  bVar1 = false;
  bVar4 = false;
  bVar8 = 0;
  if ((uVar7 & 1) == 0) {
LAB_0071e19c:
    bVar3 = QMimeData::hasHtml();
    local_d1 = 1;
    if ((bVar3 & 1) == 0) {
      str = in_RSI;
      latin1 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_RSI,in_stack_ffffffffffffff30);
      QString::QString((QString *)
                       CONCAT17(bVar8,CONCAT16(in_stack_ffffffffffffff46,
                                               CONCAT15(local_d1,in_stack_ffffffffffffff40))),latin1
                      );
      bVar4 = true;
      bVar3 = (**(code **)(*str + 0x60))(str,local_38);
      local_d1 = 1;
      if ((bVar3 & 1) == 0) {
        Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RSI);
        QString::QString((QString *)
                         CONCAT17(bVar8,CONCAT16(in_stack_ffffffffffffff46,
                                                 CONCAT15(local_d1,in_stack_ffffffffffffff40))),
                         latin1);
        bVar8 = 1;
        local_d1 = (**(code **)(*in_RSI + 0x60))(in_RSI,local_50);
      }
    }
  }
  else {
    QMimeData::text();
    bVar1 = true;
    bVar2 = QString::isEmpty((QString *)0x71e18a);
    local_d1 = 1;
    if (bVar2) goto LAB_0071e19c;
  }
  if ((bVar8 & 1) != 0) {
    QString::~QString((QString *)0x71e290);
  }
  if (bVar4) {
    QString::~QString((QString *)0x71e2a6);
  }
  if (bVar1) {
    QString::~QString((QString *)0x71e2bc);
  }
LAB_0071e31f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_d1 & 1);
}

Assistant:

bool QWidgetTextControl::canInsertFromMimeData(const QMimeData *source) const
{
    Q_D(const QWidgetTextControl);
    if (d->acceptRichText)
        return (source->hasText() && !source->text().isEmpty())
            || source->hasHtml()
            || source->hasFormat("application/x-qrichtext"_L1)
            || source->hasFormat("application/x-qt-richtext"_L1);
    else
        return source->hasText() && !source->text().isEmpty();
}